

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter_p.h
# Opt level: O0

int QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
              (char16_t u,uchar **dst,char16_t **src,char16_t *end)

{
  bool bVar1;
  char16_t low_00;
  char32_t cVar2;
  qptrdiff qVar3;
  char16_t *in_RCX;
  char16_t **in_RDX;
  uchar **in_RSI;
  char16_t in_DI;
  char32_t ucs4;
  char16_t low;
  char16_t local_6;
  
  if ((ushort)in_DI < 0x80) {
    QUtf8BaseTraits::appendByte(in_RSI,(uchar)in_DI);
    return 0;
  }
  local_6 = in_DI;
  if ((ushort)in_DI < 0x800) {
    QUtf8BaseTraits::appendByte(in_RSI,(byte)((int)(uint)(ushort)in_DI >> 6) | 0xc0);
  }
  else {
    bVar1 = QChar::isSurrogate((uint)(ushort)in_DI);
    if (bVar1) {
      qVar3 = QUtf8BaseTraits::availableUtf16(*in_RDX,in_RCX);
      if (qVar3 == 0) {
        return -2;
      }
      low_00 = QUtf8BaseTraits::peekUtf16(*in_RDX,0);
      bVar1 = QChar::isHighSurrogate((uint)(ushort)in_DI);
      if (!bVar1) {
        return -1;
      }
      bVar1 = QChar::isLowSurrogate((uint)(ushort)low_00);
      if (!bVar1) {
        return -1;
      }
      QUtf8BaseTraits::advanceUtf16(in_RDX,1);
      cVar2 = QChar::surrogateToUcs4(in_DI,low_00);
      QUtf8BaseTraits::appendByte(in_RSI,(byte)((uint)cVar2 >> 0x12) & 0xf | 0xf0);
      QUtf8BaseTraits::appendByte(in_RSI,(byte)((uint)cVar2 >> 0xc) & 0x3f | 0x80);
      local_6 = (char16_t)cVar2;
    }
    else {
      QUtf8BaseTraits::appendByte(in_RSI,(byte)((int)(uint)(ushort)in_DI >> 0xc) | 0xe0);
    }
    QUtf8BaseTraits::appendByte(in_RSI,(byte)((int)(uint)(ushort)local_6 >> 6) & 0x3f | 0x80);
  }
  QUtf8BaseTraits::appendByte(in_RSI,(byte)local_6 & 0x3f | 0x80);
  return 0;
}

Assistant:

inline
    int toUtf8(char16_t u, OutputPtr &dst, InputPtr &src, InputPtr end)
    {
        if (!Traits::skipAsciiHandling && u < 0x80) {
            // U+0000 to U+007F (US-ASCII) - one byte
            Traits::appendByte(dst, uchar(u));
            return 0;
        } else if (u < 0x0800) {
            // U+0080 to U+07FF - two bytes
            // first of two bytes
            Traits::appendByte(dst, 0xc0 | uchar(u >> 6));
        } else {
            if (!QChar::isSurrogate(u)) {
                // U+0800 to U+FFFF (except U+D800-U+DFFF) - three bytes
                if (!Traits::allowNonCharacters && QChar::isNonCharacter(u))
                    return Traits::Error;

                // first of three bytes
                Traits::appendByte(dst, 0xe0 | uchar(u >> 12));
            } else {
                // U+10000 to U+10FFFF - four bytes
                // need to get one extra codepoint
                if (Traits::availableUtf16(src, end) == 0)
                    return Traits::EndOfString;

                char16_t low = Traits::peekUtf16(src);
                if (!QChar::isHighSurrogate(u))
                    return Traits::Error;
                if (!QChar::isLowSurrogate(low))
                    return Traits::Error;

                Traits::advanceUtf16(src);
                char32_t ucs4 = QChar::surrogateToUcs4(u, low);

                if (!Traits::allowNonCharacters && QChar::isNonCharacter(ucs4))
                    return Traits::Error;

                // first byte
                Traits::appendByte(dst, 0xf0 | (uchar(ucs4 >> 18) & 0xf));

                // second of four bytes
                Traits::appendByte(dst, 0x80 | (uchar(ucs4 >> 12) & 0x3f));

                // for the rest of the bytes
                u = char16_t(ucs4);
            }

            // second to last byte
            Traits::appendByte(dst, 0x80 | (uchar(u >> 6) & 0x3f));
        }

        // last byte
        Traits::appendByte(dst, 0x80 | (u & 0x3f));
        return 0;
    }